

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

int read_skip_txfm(AV1_COMMON *cm,MACROBLOCKD *xd,int segment_id,aom_reader *r)

{
  int iVar1;
  uint8_t in_DL;
  MACROBLOCKD *in_RSI;
  long in_RDI;
  int skip_txfm;
  FRAME_CONTEXT *ec_ctx;
  int ctx;
  aom_cdf_prob *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 local_4;
  
  iVar1 = segfeature_active((segmentation *)(in_RDI + 19000),in_DL,'\x06');
  if (iVar1 == 0) {
    av1_get_skip_txfm_context(in_RSI);
    local_4 = aom_read_symbol_((aom_reader *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               in_stack_ffffffffffffffb8,0);
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int read_skip_txfm(AV1_COMMON *cm, const MACROBLOCKD *xd, int segment_id,
                          aom_reader *r) {
  if (segfeature_active(&cm->seg, segment_id, SEG_LVL_SKIP)) {
    return 1;
  } else {
    const int ctx = av1_get_skip_txfm_context(xd);
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
    const int skip_txfm =
        aom_read_symbol(r, ec_ctx->skip_txfm_cdfs[ctx], 2, ACCT_STR);
    return skip_txfm;
  }
}